

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::Skip(EpsCopyOutputStream *this,int count,uint8 **pp)

{
  uint8 *puVar1;
  bool bVar2;
  int iVar3;
  uint8 *puVar4;
  uint uVar5;
  uint8 *puVar6;
  int iVar7;
  uint8 *local_48;
  void *data;
  int local_34 [2];
  int size;
  
  if (-1 < count) {
    if ((this->had_error_ != true) && (local_34[0] = Flush(this,*pp), this->had_error_ != true)) {
      local_48 = this->buffer_end_;
      data = pp;
      do {
        iVar7 = count - local_34[0];
        bVar2 = count < local_34[0];
        if (iVar7 == 0 || count < local_34[0]) {
          local_48 = local_48 + count;
          uVar5 = local_34[0] - count;
          puVar6 = (uint8 *)0x0;
          puVar1 = local_48 + ((ulong)uVar5 - 0x10);
          puVar4 = local_48;
          if ((int)uVar5 < 0x11) {
            puVar4 = this->buffer_;
            puVar1 = this->buffer_ + (int)uVar5;
            puVar6 = local_48;
          }
          this->end_ = puVar1;
          this->buffer_end_ = puVar6;
          goto LAB_0015c58d;
        }
        iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_48,local_34);
        count = iVar7;
      } while ((char)iVar3 != '\0');
      this->had_error_ = true;
      puVar4 = this->buffer_;
      this->end_ = this->buffer_ + 0x10;
LAB_0015c58d:
      *(uint8 **)data = puVar4;
      return iVar7 == 0 || bVar2;
    }
    *pp = this->buffer_;
  }
  return false;
}

Assistant:

bool EpsCopyOutputStream::Skip(int count, uint8** pp) {
  if (count < 0) return false;
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  int size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  void* data = buffer_end_;
  while (count > size) {
    count -= size;
    if (!stream_->Next(&data, &size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(static_cast<uint8*>(data) + count, size - count);
  return true;
}